

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotShadedEx<ImPlot::GetterXsYs<int>,ImPlot::GetterXsYRef<int>>
               (char *label_id,GetterXsYs<int> *getter1,GetterXsYRef<int> *getter2,bool fit2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  int *piVar10;
  ImPlotPlot *pIVar11;
  double dVar12;
  double dVar13;
  ImPlotRange *pIVar14;
  ImPlotContext *pIVar15;
  bool bVar16;
  ImU32 col;
  long lVar17;
  ImDrawList *DrawList;
  undefined7 in_register_00000009;
  uint uVar18;
  byte bVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  double dVar23;
  double dVar24;
  byte local_8c;
  byte local_88;
  TransformerLinLin local_84;
  GetterXsYRef<int> *local_80;
  GetterXsYs<int> *local_78;
  undefined8 local_70;
  undefined4 local_64;
  ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLinLin>
  local_60;
  
  bVar16 = BeginItem(label_id,1);
  pIVar15 = GImPlot;
  if (bVar16) {
    if (GImPlot->FitThisFrame == true) {
      local_64 = (undefined4)CONCAT71(in_register_00000009,fit2);
      iVar1 = getter1->Count;
      if (0 < iVar1) {
        piVar9 = getter1->Xs;
        piVar10 = getter1->Ys;
        iVar2 = getter1->Offset;
        iVar3 = getter1->Stride;
        pIVar11 = GImPlot->CurrentPlot;
        iVar4 = pIVar11->CurrentYAxis;
        uVar5 = (pIVar11->XAxis).Flags;
        pIVar14 = GImPlot->ExtentsY;
        uVar6 = pIVar11->YAxis[iVar4].Flags;
        iVar20 = 0;
        uVar18 = uVar6 & 0x20;
        local_70 = (double)(CONCAT44(local_70._4_4_,uVar5) & 0xffffffff00000020);
        do {
          lVar17 = (long)(((iVar2 + iVar20) % iVar1 + iVar1) % iVar1) * (long)iVar3;
          iVar7 = *(int *)((long)piVar9 + lVar17);
          dVar24 = (double)iVar7;
          iVar8 = *(int *)((long)piVar10 + lVar17);
          dVar23 = (double)iVar8;
          if ((uVar5 >> 10 & 1) == 0) {
            if ((0 < iVar7) || ((int)local_70 == 0)) {
LAB_001ea63f:
              dVar12 = (pIVar15->ExtentsX).Min;
              dVar13 = (pIVar15->ExtentsX).Max;
              uVar21 = -(ulong)(dVar24 < dVar12);
              uVar22 = -(ulong)(dVar13 < dVar24);
              (pIVar15->ExtentsX).Min = (double)(~uVar21 & (ulong)dVar12 | (ulong)dVar24 & uVar21);
              (pIVar15->ExtentsX).Max = (double)(~uVar22 & (ulong)dVar13 | (ulong)dVar24 & uVar22);
            }
          }
          else if (((pIVar11->YAxis[iVar4].Range.Min <= dVar23) &&
                   (dVar23 <= pIVar11->YAxis[iVar4].Range.Max)) &&
                  (local_8c = (byte)((uVar5 & 0x20) >> 5), (iVar7 < 1 & local_8c) == 0))
          goto LAB_001ea63f;
          if ((uVar6 >> 10 & 1) == 0) {
            if ((0 < iVar8) || (uVar18 == 0)) {
LAB_001ea6aa:
              dVar24 = pIVar14[iVar4].Min;
              dVar12 = pIVar15->ExtentsY[iVar4].Max;
              uVar21 = -(ulong)(dVar23 < dVar24);
              uVar22 = -(ulong)(dVar12 < dVar23);
              pIVar14[iVar4].Min = (double)(~uVar21 & (ulong)dVar24 | (ulong)dVar23 & uVar21);
              pIVar15->ExtentsY[iVar4].Max =
                   (double)(~uVar22 & (ulong)dVar12 | (ulong)dVar23 & uVar22);
            }
          }
          else if ((((pIVar11->XAxis).Range.Min <= dVar24) && (dVar24 <= (pIVar11->XAxis).Range.Max)
                   ) && (local_88 = (byte)(uVar18 >> 5), (iVar8 < 1 & local_88) == 0))
          goto LAB_001ea6aa;
          iVar20 = iVar20 + 1;
        } while (iVar1 != iVar20);
      }
      if ((fit2) && (iVar1 = getter2->Count, 0 < iVar1)) {
        piVar9 = getter2->Xs;
        iVar2 = getter2->Offset;
        iVar3 = getter2->Stride;
        dVar23 = getter2->YRef;
        pIVar11 = pIVar15->CurrentPlot;
        iVar4 = pIVar11->CurrentYAxis;
        uVar5 = (pIVar11->XAxis).Flags;
        uVar6 = pIVar11->YAxis[iVar4].Flags;
        local_70 = ABS(dVar23);
        bVar19 = dVar23 <= 0.0 & (byte)((uVar6 & 0x20) >> 5);
        iVar20 = 0;
        uVar18 = uVar5 & 0x20;
        do {
          iVar7 = *(int *)((long)piVar9 +
                          (long)(((iVar2 + iVar20) % iVar1 + iVar1) % iVar1) * (long)iVar3);
          dVar24 = (double)iVar7;
          if ((uVar5 >> 10 & 1) == 0) {
            if ((0 < iVar7) || (uVar18 == 0)) {
LAB_001ea7e6:
              dVar12 = (pIVar15->ExtentsX).Min;
              dVar13 = (pIVar15->ExtentsX).Max;
              uVar21 = -(ulong)(dVar24 < dVar12);
              uVar22 = -(ulong)(dVar13 < dVar24);
              (pIVar15->ExtentsX).Min = (double)(~uVar21 & (ulong)dVar12 | (ulong)dVar24 & uVar21);
              (pIVar15->ExtentsX).Max = (double)(~uVar22 & (ulong)dVar13 | (ulong)dVar24 & uVar22);
            }
          }
          else if (((pIVar11->YAxis[iVar4].Range.Min <= dVar23) &&
                   (dVar23 <= pIVar11->YAxis[iVar4].Range.Max)) &&
                  (local_8c = (byte)(uVar18 >> 5), (iVar7 < 1 & local_8c) == 0)) goto LAB_001ea7e6;
          if ((uVar6 >> 10 & 1) == 0) {
            if ((ulong)local_70 < 0x7ff0000000000000 && bVar19 == 0) {
LAB_001ea82d:
              dVar24 = pIVar15->ExtentsY[iVar4].Min;
              dVar12 = pIVar15->ExtentsY[iVar4].Max;
              uVar21 = -(ulong)(dVar23 < dVar24);
              uVar22 = -(ulong)(dVar12 < dVar23);
              pIVar15->ExtentsY[iVar4].Min =
                   (double)(~uVar21 & (ulong)dVar24 | (ulong)dVar23 & uVar21);
              pIVar15->ExtentsY[iVar4].Max =
                   (double)(~uVar22 & (ulong)dVar12 | (ulong)dVar23 & uVar22);
            }
          }
          else if (((ulong)local_70 < 0x7ff0000000000000 && bVar19 == 0) &&
                   (dVar24 <= (pIVar11->XAxis).Range.Max && (pIVar11->XAxis).Range.Min <= dVar24))
          goto LAB_001ea82d;
          iVar20 = iVar20 + 1;
        } while (iVar1 != iVar20);
      }
    }
    local_80 = getter2;
    local_78 = getter1;
    DrawList = GetPlotDrawList();
    if ((pIVar15->NextItemData).RenderFill == true) {
      col = ImGui::GetColorU32((pIVar15->NextItemData).Colors + 1);
      iVar1 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar1]) {
      case 0:
        local_84.YAxis = iVar1;
        ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLinLin>
        ::ShadedRenderer(&local_60,local_78,local_80,&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<int>,ImPlot::GetterXsYRef<int>,ImPlot::TransformerLinLin>>
                  (&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 1:
        local_84.YAxis = iVar1;
        ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLogLin>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLogLin>
                          *)&local_60,local_78,local_80,(TransformerLogLin *)&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<int>,ImPlot::GetterXsYRef<int>,ImPlot::TransformerLogLin>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLogLin>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 2:
        local_84.YAxis = iVar1;
        ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLinLog>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLinLog>
                          *)&local_60,local_78,local_80,(TransformerLinLog *)&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<int>,ImPlot::GetterXsYRef<int>,ImPlot::TransformerLinLog>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLinLog>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 3:
        local_84.YAxis = iVar1;
        ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLogLog>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLogLog>
                          *)&local_60,local_78,local_80,(TransformerLogLog *)&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<int>,ImPlot::GetterXsYRef<int>,ImPlot::TransformerLogLog>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLogLog>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
      }
    }
    pIVar15 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar15->NextItemData);
    pIVar15->PreviousItem = pIVar15->CurrentItem;
    pIVar15->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotShadedEx(const char* label_id, const Getter1& getter1, const Getter2& getter2, bool fit2) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter1.Count; ++i)
                FitPoint(getter1(i));
            if (fit2) {
                for (int i = 0; i < getter2.Count; ++i)
                    FitPoint(getter2(i));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList & DrawList = *GetPlotDrawList();
        if (s.RenderFill) {
            ImU32 col = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLin>(getter1,getter2,TransformerLinLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLin>(getter1,getter2,TransformerLogLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LinLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLog>(getter1,getter2,TransformerLinLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLog>(getter1,getter2,TransformerLogLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
            }
        }
        EndItem();
    }
}